

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void lj_record_call(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  BCReg BVar1;
  
  rec_call_setup(J,func,nargs);
  J->framedepth = J->framedepth + 1;
  J->base = J->base + (func + 2);
  BVar1 = func + 2 + J->baseslot;
  J->baseslot = BVar1;
  if (BVar1 + J->maxslot < 0xfa) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

void lj_record_call(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  /* Bump frame. */
  J->framedepth++;
  J->base += func+1+LJ_FR2;
  J->baseslot += func+1+LJ_FR2;
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}